

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

ReadMultipleData
deqp::gles31::Functional::anon_unknown_1::op::ReadMultipleData::Generate
          (int targetHandle0,int seed0,int targetHandle1,int seed1)

{
  ReadMultipleData RVar1;
  int seed1_local;
  int targetHandle1_local;
  int seed0_local;
  int targetHandle0_local;
  ReadMultipleData retVal;
  
  RVar1.seed0 = seed0;
  RVar1.targetHandle0 = targetHandle0;
  RVar1.targetHandle1 = targetHandle1;
  RVar1.seed1 = seed1;
  return RVar1;
}

Assistant:

static ReadMultipleData Generate(int targetHandle0, int seed0, int targetHandle1, int seed1)
	{
		ReadMultipleData retVal;

		retVal.targetHandle0 = targetHandle0;
		retVal.seed0 = seed0;
		retVal.targetHandle1 = targetHandle1;
		retVal.seed1 = seed1;

		return retVal;
	}